

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

int __thiscall CGraphics_Threaded::Init(CGraphics_Threaded *this)

{
  long lVar1;
  char cVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  IStorage *pIVar6;
  long *plVar7;
  CConfig *pCVar8;
  IConsole *pIVar9;
  long lVar10;
  IGraphicsBackend *pIVar11;
  CCommandBuffer *this_00;
  ulong uVar12;
  char cVar13;
  int x;
  ulong uVar14;
  ulong uVar15;
  int y;
  ulong uVar16;
  ulong uVar17;
  uchar uVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  long lVar20;
  uchar aNullTextureData [4096];
  
  aNullTextureData[0x10] = '\0';
  aNullTextureData[0x11] = '\0';
  aNullTextureData[0x12] = '\0';
  aNullTextureData[0x13] = '\0';
  aNullTextureData[0x14] = '\0';
  aNullTextureData[0x15] = '\0';
  aNullTextureData[0x16] = '\0';
  aNullTextureData[0x17] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar6 = (IStorage *)
           (**(code **)(**(long **)&this->field_0x8 + 0x10))(*(long **)&this->field_0x8,"storage");
  this->m_pStorage = pIVar6;
  plVar7 = (long *)(**(code **)(**(long **)&this->field_0x8 + 0x10))
                             (*(long **)&this->field_0x8,"config");
  pCVar8 = (CConfig *)(**(code **)(*plVar7 + 0x30))(plVar7);
  this->m_pConfig = pCVar8;
  pIVar9 = (IConsole *)
           (**(code **)(**(long **)&this->field_0x8 + 0x10))(*(long **)&this->field_0x8,"console");
  this->m_pConsole = pIVar9;
  this->m_FirstFreeTexture = 0;
  auVar3 = _DAT_001d6390;
  lVar10 = 0x4806c;
  auVar19 = _DAT_001d6f30;
  do {
    lVar20 = auVar19._8_8_;
    if (SUB164(auVar19 ^ auVar3,4) == -0x80000000 && SUB164(auVar19 ^ auVar3,0) < -0x7ffff001) {
      *(int *)((long)this->m_apCommandBuffers + lVar10 * 4 + -0x6c) = (int)(auVar19._0_8_ + 1);
      *(int *)((long)this->m_apCommandBuffers + lVar10 * 4 + -0x68) = (int)(lVar20 + 1);
    }
    auVar19._0_8_ = auVar19._0_8_ + 2;
    auVar19._8_8_ = lVar20 + 2;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0x4906c);
  this->m_aTextureIndices[0xfff] = -1;
  pIVar11 = CreateGraphicsBackend();
  this->m_pBackend = pIVar11;
  iVar4 = InitWindow(this);
  iVar5 = -1;
  if (iVar4 == 0) {
    *(float *)&this->field_0x20 =
         (float)*(int *)&this->field_0x10 / (float)this->m_pConfig->m_GfxScreenWidth;
    lVar10 = 0xd;
    do {
      this_00 = (CCommandBuffer *)operator_new(0x30);
      CCommandBuffer::CCommandBuffer(this_00,0x20000,0x200000);
      this->m_apCommandBuffers[lVar10 + -0xd] = this_00;
      lVar10 = lVar10 + 1;
    } while (lVar10 == 0xe);
    this->m_pCommandBuffer = this->m_apCommandBuffers[0];
    uVar12 = 0;
    cVar13 = '\0';
    uVar14 = 0;
    do {
      lVar10 = -0x100;
      uVar16 = 0;
      uVar15 = uVar12;
      do {
        cVar2 = (char)lVar10;
        if (uVar14 < 0x10) {
          if (uVar16 < 0x10) {
            aNullTextureData[uVar15] = cVar13 + cVar2 + '\x0f';
            aNullTextureData[uVar15 + 1] = '\0';
          }
          else {
            aNullTextureData[uVar15] = '\0';
            aNullTextureData[uVar15 + 1] = cVar13 + cVar2 + 0x8f;
          }
          uVar18 = '\0';
          uVar17 = uVar16 << 7 | uVar14 * 4;
        }
        else if (uVar16 < 0x10) {
          (aNullTextureData + uVar15)[0] = '\0';
          (aNullTextureData + uVar15)[1] = '\0';
          uVar18 = cVar13 + cVar2 + 0x8f;
          uVar17 = uVar16 * 0x80 + uVar14 * 4;
        }
        else {
          uVar18 = cVar13 + cVar2 + '\x10';
          aNullTextureData[uVar15] = uVar18;
          aNullTextureData[uVar15 + 1] = uVar18;
          uVar18 = '\0';
          uVar17 = uVar15;
        }
        aNullTextureData[uVar17 + 2] = uVar18;
        aNullTextureData[uVar15 + 3] = 0xff;
        uVar16 = uVar16 + 1;
        uVar15 = uVar15 + 0x80;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0);
      uVar14 = uVar14 + 1;
      cVar13 = cVar13 + '\b';
      uVar12 = uVar12 + 4;
    } while (uVar14 != 0x20);
    iVar4 = (**(code **)(*(long *)this + 0x80))(this,0x20,0x20,1,aNullTextureData,1,9);
    (this->m_InvalidTexture).m_Id = iVar4;
    iVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int CGraphics_Threaded::Init()
{
	// fetch pointers
	m_pStorage = Kernel()->RequestInterface<IStorage>();
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pConsole = Kernel()->RequestInterface<IConsole>();

	// init textures
	m_FirstFreeTexture = 0;
	for(int i = 0; i < MAX_TEXTURES-1; i++)
		m_aTextureIndices[i] = i+1;
	m_aTextureIndices[MAX_TEXTURES-1] = -1;

	m_pBackend = CreateGraphicsBackend();
	if(InitWindow() != 0)
		return -1;

	m_ScreenHiDPIScale = m_ScreenWidth / (float)m_pConfig->m_GfxScreenWidth;

	// create command buffers
	for(int i = 0; i < NUM_CMDBUFFERS; i++)
		m_apCommandBuffers[i] = new CCommandBuffer(128*1024, 2*1024*1024);
	m_pCommandBuffer = m_apCommandBuffers[0];

	// create null texture, will get id=0
	unsigned char aNullTextureData[4*32*32];
	for(int x = 0; x < 32; ++x)
		for(int y = 0; y < 32; ++y)
		{
			if(x < 16)
			{
				if(y < 16)
				{
					aNullTextureData[4*(y*32+x)+0] = y*8+x*8+15;
					aNullTextureData[4*(y*32+x)+1] = 0;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
				else
				{
					aNullTextureData[4*(y*32+x)+0] = 0;
					aNullTextureData[4*(y*32+x)+1] = y*8+x*8-113;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
			}
			else
			{
				if(y < 16)
				{
					aNullTextureData[4*(y*32+x)+0] = 0;
					aNullTextureData[4*(y*32+x)+1] = 0;
					aNullTextureData[4*(y*32+x)+2] = y*8+x*8-113;
				}
				else
				{
					aNullTextureData[4*(y*32+x)+0] = y*8+x*8-496;
					aNullTextureData[4*(y*32+x)+1] = y*8+x*8-496;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
			}
			aNullTextureData[4*(y*32+x)+3] = 255;
		}

	m_InvalidTexture = LoadTextureRaw(32,32,CImageInfo::FORMAT_RGBA,aNullTextureData,CImageInfo::FORMAT_RGBA,TEXLOAD_NORESAMPLE|TEXLOAD_MULTI_DIMENSION);
	return 0;
}